

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

int m256v_iszero(m256v *M)

{
  int iVar1;
  int *in_RDI;
  int r;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*in_RDI <= iVar2) {
      return 1;
    }
    iVar1 = m256v_row_iszero((m256v *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),0);
    if (iVar1 == 0) break;
    iVar2 = iVar2 + 1;
  }
  return 0;
}

Assistant:

int MV_GEN_N(_iszero)(const MV_GEN_TYPE* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		if (!MV_GEN_N(_row_iszero)(M, r)) {
			return 0;
		}
	}
	return 1;
}